

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Subtract(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                  uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                  uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  uint8_t *local_f0;
  byte *local_e8;
  byte *local_e0;
  uint8_t *local_b8;
  undefined1 (*local_b0) [16];
  undefined1 (*local_a8) [16];
  uint8_t *local_a0;
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *in2X;
  uint8_t *in1X;
  simd data;
  simd *src1End;
  simd *dst;
  simd *src2;
  simd *src1;
  uint8_t *outY_local;
  uint8_t *in2Y_local;
  uint8_t *in1Y_local;
  uint32_t rowSizeOut_local;
  uint32_t rowSizeIn2_local;
  uint32_t rowSizeIn1_local;
  
  local_98 = (undefined1 (*) [16])in2Y;
  local_90 = (undefined1 (*) [16])in1Y;
  for (local_a0 = outY; local_a0 != outYEnd; local_a0 = local_a0 + rowSizeOut) {
    local_b0 = local_98;
    local_b8 = local_a0;
    for (local_a8 = local_90; local_a8 != local_90 + simdWidth; local_a8 = local_a8 + 1) {
      auVar1 = vpminub_avx(*local_a8,*local_b0);
      auVar1 = vpsubb_avx(*local_a8,auVar1);
      in1X = auVar1._0_8_;
      data[0] = auVar1._8_8_;
      *(uint8_t **)local_b8 = in1X;
      *(longlong *)(local_b8 + 8) = data[0];
      local_b0 = local_b0 + 1;
      local_b8 = local_b8 + 0x10;
    }
    if (nonSimdWidth != 0) {
      local_e0 = *local_90 + totalSimdWidth;
      local_e8 = *local_98 + totalSimdWidth;
      local_f0 = local_a0 + totalSimdWidth;
      puVar2 = local_f0 + nonSimdWidth;
      for (; local_f0 != puVar2; local_f0 = local_f0 + 1) {
        if (*local_e0 < *local_e8) {
          *local_f0 = '\0';
        }
        else {
          *local_f0 = *local_e0 - *local_e8;
        }
        local_e0 = local_e0 + 1;
        local_e8 = local_e8 + 1;
      }
    }
    local_90 = (undefined1 (*) [16])(*local_90 + rowSizeIn1);
    local_98 = (undefined1 (*) [16])(*local_98 + rowSizeIn2);
  }
  return;
}

Assistant:

void Subtract( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                   uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data = _mm_loadu_si128( src1 );
                _mm_storeu_si128( dst, _mm_sub_epi8( data, _mm_min_epu8( data, _mm_loadu_si128( src2 ) ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X ) {
                    if( (*in2X) > (*in1X) )
                        (*outX) = 0u;
                    else
                        (*outX) = static_cast<uint8_t>( (*in1X) - (*in2X) );
                }
            }
        }
    }